

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O2

UpVal ** getupvalref(lua_State *L,int fidx,int n,LClosure **pf)

{
  LClosure *pLVar1;
  TValue *pTVar2;
  UpVal **ppUVar3;
  
  pTVar2 = index2value(L,fidx);
  pLVar1 = (LClosure *)(pTVar2->value_).f;
  if (pf != (LClosure **)0x0) {
    *pf = pLVar1;
  }
  ppUVar3 = &getupvalref::nullup;
  if ((0 < n) && (n <= pLVar1->p->sizeupvalues)) {
    ppUVar3 = pLVar1->upvals + (n - 1);
  }
  return ppUVar3;
}

Assistant:

static UpVal **getupvalref (lua_State *L, int fidx, int n, LClosure **pf) {
  static const UpVal *const nullup = NULL;
  LClosure *f;
  TValue *fi = index2value(L, fidx);
  api_check(L, ttisLclosure(fi), "Lua function expected");
  f = clLvalue(fi);
  if (pf) *pf = f;
  if (1 <= n && n <= f->p->sizeupvalues)
    return &f->upvals[n - 1];  /* get its upvalue pointer */
  else
    return (UpVal**)&nullup;
}